

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

void Abc_NtkDelayTraceCritPathCollect_rec
               (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Vec_Int_t *vBest,Vec_Ptr_t *vPath)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  
  uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
  if ((uVar1 != 2) && (uVar1 != 5)) {
    if (uVar1 != 7) {
      __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x36c,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
    iVar3 = pNode->Id;
    if (((long)iVar3 < 0) || (vBest->nSize <= iVar3)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((long)vBest->pArray[iVar3] < 0) {
      __assert_fail("iFanin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcTiming.c"
                    ,0x370,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
    Abc_NtkDelayTraceCritPathCollect_rec
              (vSlacks,(Abc_Obj_t *)
                       pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[vBest->pArray[iVar3]]],
               vBest,vPath);
  }
  uVar1 = vPath->nCap;
  if (vPath->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vPath->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vPath->pArray,0x80);
      }
      vPath->pArray = ppvVar2;
      iVar3 = 0x10;
    }
    else {
      iVar3 = uVar1 * 2;
      if (iVar3 <= (int)uVar1) goto LAB_0031a818;
      if (vPath->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vPath->pArray,(ulong)uVar1 << 4);
      }
      vPath->pArray = ppvVar2;
    }
    vPath->nCap = iVar3;
  }
LAB_0031a818:
  iVar3 = vPath->nSize;
  vPath->nSize = iVar3 + 1;
  vPath->pArray[iVar3] = pNode;
  return;
}

Assistant:

void Abc_NtkDelayTraceCritPathCollect_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Vec_Int_t * vBest, Vec_Ptr_t * vPath )
{
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    if ( Abc_ObjIsNode(pNode) )
    {
        int iFanin = Vec_IntEntry( vBest, Abc_ObjId(pNode) );
        assert( iFanin >= 0 );
        Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin(pNode, iFanin), vBest, vPath );
    }
    Vec_PtrPush( vPath, pNode );
}